

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

bool cmQtAutoGenerator::MakeParentDirectory(string *filename)

{
  Status SVar1;
  bool bVar2;
  string dirName;
  string sStack_28;
  
  cmsys::SystemTools::GetFilenamePath(&sStack_28,filename);
  if (sStack_28._M_string_length == 0) {
    bVar2 = true;
  }
  else {
    SVar1 = cmsys::SystemTools::MakeDirectory(&sStack_28,(mode_t *)0x0);
    bVar2 = SVar1.Kind_ == Success;
  }
  std::__cxx11::string::~string((string *)&sStack_28);
  return bVar2;
}

Assistant:

bool cmQtAutoGenerator::MakeParentDirectory(std::string const& filename)
{
  bool success = true;
  std::string const dirName = cmSystemTools::GetFilenamePath(filename);
  if (!dirName.empty()) {
    success = static_cast<bool>(cmSystemTools::MakeDirectory(dirName));
  }
  return success;
}